

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Intrinsics.cpp
# Opt level: O1

IntrinsicType __thiscall soul::getIntrinsicTypeFromName(soul *this,string_view s)

{
  soul *psVar1;
  int iVar2;
  IntrinsicType IVar3;
  void *__s1;
  size_type __rlen;
  
  __s1 = (void *)s._M_len;
  IVar3 = none;
  psVar1 = this + -3;
  switch(psVar1) {
  case (soul *)0x0:
    iVar2 = bcmp(__s1,"abs",(size_t)this);
    if (iVar2 == 0) {
      return abs;
    }
    switch(psVar1) {
    case (soul *)0x0:
      iVar2 = bcmp(__s1,"min",(size_t)this);
      if (iVar2 == 0) {
        return min;
      }
      switch(psVar1) {
      case (soul *)0x0:
        iVar2 = bcmp(__s1,"max",(size_t)this);
        if (iVar2 == 0) {
          return max;
        }
        switch(psVar1) {
        case (soul *)0x0:
          goto switchD_001ae9c0_caseD_0;
        case (soul *)0x1:
          goto switchD_001ae794_caseD_1;
        case (soul *)0x2:
          goto switchD_001ae794_caseD_2;
        default:
          goto switchD_001ae794_caseD_3;
        case (soul *)0x4:
          goto switchD_001ae794_caseD_4;
        case (soul *)0x6:
          goto switchD_001ae794_caseD_6;
        case (soul *)0x7:
          goto switchD_001ae794_caseD_7;
        case (soul *)0x9:
          goto switchD_001ae794_caseD_9;
        case (soul *)0xb:
          goto switchD_001ae794_caseD_b;
        case (soul *)0x13:
          break;
        }
      case (soul *)0x1:
        goto switchD_001ae794_caseD_1;
      case (soul *)0x2:
        goto switchD_001ae794_caseD_2;
      default:
        goto switchD_001ae794_caseD_3;
      case (soul *)0x4:
        goto switchD_001ae794_caseD_4;
      case (soul *)0x6:
        goto switchD_001ae794_caseD_6;
      case (soul *)0x7:
        goto switchD_001ae794_caseD_7;
      case (soul *)0x9:
        goto switchD_001ae794_caseD_9;
      case (soul *)0xb:
        goto switchD_001ae794_caseD_b;
      case (soul *)0x13:
        break;
      }
    case (soul *)0x1:
      goto switchD_001ae794_caseD_1;
    case (soul *)0x2:
      goto switchD_001ae794_caseD_2;
    default:
      goto switchD_001ae794_caseD_3;
    case (soul *)0x4:
      goto switchD_001ae794_caseD_4;
    case (soul *)0x6:
      goto switchD_001ae794_caseD_6;
    case (soul *)0x7:
      goto switchD_001ae794_caseD_7;
    case (soul *)0x9:
      goto switchD_001ae794_caseD_9;
    case (soul *)0xb:
      goto switchD_001ae794_caseD_b;
    case (soul *)0x13:
      break;
    }
  case (soul *)0x1:
switchD_001ae794_caseD_1:
    iVar2 = bcmp(__s1,"wrap",(size_t)this);
    if (iVar2 == 0) {
      return wrap;
    }
    switch(psVar1) {
    case (soul *)0x0:
      goto switchD_001ae9c0_caseD_0;
    case (soul *)0x1:
      iVar2 = bcmp(__s1,"fmod",(size_t)this);
      if (iVar2 == 0) {
        return fmod;
      }
      switch(psVar1) {
      case (soul *)0x0:
        goto switchD_001ae9c0_caseD_0;
      case (soul *)0x1:
        goto switchD_001ae8fc_caseD_1;
      case (soul *)0x2:
        goto switchD_001ae8fc_caseD_2;
      default:
        goto switchD_001ae794_caseD_3;
      case (soul *)0x4:
        goto switchD_001ae794_caseD_4;
      case (soul *)0x6:
        goto switchD_001ae794_caseD_6;
      case (soul *)0x7:
        goto switchD_001ae794_caseD_7;
      case (soul *)0x9:
        goto switchD_001ae794_caseD_9;
      case (soul *)0xb:
        goto switchD_001ae794_caseD_b;
      case (soul *)0x13:
        break;
      }
    case (soul *)0x2:
      goto switchD_001ae8fc_caseD_2;
    default:
      goto switchD_001ae794_caseD_3;
    case (soul *)0x4:
      goto switchD_001ae794_caseD_4;
    case (soul *)0x6:
      goto switchD_001ae794_caseD_6;
    case (soul *)0x7:
      goto switchD_001ae794_caseD_7;
    case (soul *)0x9:
      goto switchD_001ae794_caseD_9;
    case (soul *)0xb:
      goto switchD_001ae794_caseD_b;
    case (soul *)0x13:
      break;
    }
  case (soul *)0x2:
switchD_001ae794_caseD_2:
    iVar2 = bcmp(__s1,"clamp",(size_t)this);
    if (iVar2 == 0) {
      return clamp;
    }
    switch(psVar1) {
    case (soul *)0x0:
      goto switchD_001ae9c0_caseD_0;
    case (soul *)0x1:
      goto switchD_001ae794_caseD_1;
    case (soul *)0x2:
      goto switchD_001ae8fc_caseD_2;
    default:
      goto switchD_001ae794_caseD_3;
    case (soul *)0x4:
      goto switchD_001ae794_caseD_4;
    case (soul *)0x6:
      goto switchD_001ae794_caseD_6;
    case (soul *)0x7:
      goto switchD_001ae794_caseD_7;
    case (soul *)0x9:
      goto switchD_001ae794_caseD_9;
    case (soul *)0xb:
      goto switchD_001ae794_caseD_b;
    case (soul *)0x13:
      break;
    }
  default:
    goto switchD_001ae794_caseD_3;
  case (soul *)0x4:
switchD_001ae794_caseD_4:
    iVar2 = bcmp(__s1,"product",(size_t)this);
    if (iVar2 == 0) {
      return product;
    }
    if (this == (soul *)0x4) goto switchD_001aedea_caseD_1;
    if (this != (soul *)0x16) {
      if (this != (soul *)0xe) {
        return none;
      }
      goto switchD_001ae794_caseD_b;
    }
    break;
  case (soul *)0x6:
switchD_001ae794_caseD_6:
    iVar2 = bcmp(__s1,"remainder",(size_t)this);
    if (iVar2 == 0) {
      return remainder;
    }
    switch(psVar1) {
    case (soul *)0x0:
      goto switchD_001ae9c0_caseD_0;
    case (soul *)0x1:
switchD_001ae8fc_caseD_1:
      iVar2 = bcmp(__s1,"ceil",(size_t)this);
      if (iVar2 == 0) {
        return ceil;
      }
      switch(psVar1) {
      case (soul *)0x0:
        goto switchD_001ae9c0_caseD_0;
      case (soul *)0x1:
        goto switchD_001ae9c0_caseD_1;
      case (soul *)0x2:
        goto switchD_001ae9c0_caseD_2;
      default:
        goto switchD_001ae794_caseD_3;
      case (soul *)0x4:
        goto switchD_001ae794_caseD_4;
      case (soul *)0x7:
        goto switchD_001ae794_caseD_7;
      case (soul *)0x9:
        goto switchD_001ae794_caseD_9;
      case (soul *)0xb:
        goto switchD_001ae794_caseD_b;
      case (soul *)0x13:
        break;
      }
    case (soul *)0x2:
switchD_001ae8fc_caseD_2:
      iVar2 = bcmp(__s1,"floor",(size_t)this);
      if (iVar2 == 0) {
        return floor;
      }
      switch(psVar1) {
      case (soul *)0x0:
        goto switchD_001ae9c0_caseD_0;
      case (soul *)0x1:
        goto switchD_001ae8fc_caseD_1;
      case (soul *)0x2:
        goto switchD_001ae9c0_caseD_2;
      default:
        goto switchD_001ae794_caseD_3;
      case (soul *)0x4:
        goto switchD_001ae794_caseD_4;
      case (soul *)0x7:
        goto switchD_001ae794_caseD_7;
      case (soul *)0x9:
        goto switchD_001ae794_caseD_9;
      case (soul *)0xb:
        goto switchD_001ae794_caseD_b;
      case (soul *)0x13:
        break;
      }
    default:
      goto switchD_001ae794_caseD_3;
    case (soul *)0x4:
      goto switchD_001ae794_caseD_4;
    case (soul *)0x7:
      goto switchD_001ae794_caseD_7;
    case (soul *)0x9:
      goto switchD_001ae794_caseD_9;
    case (soul *)0xb:
      goto switchD_001ae794_caseD_b;
    case (soul *)0x13:
      break;
    }
  case (soul *)0x7:
switchD_001ae794_caseD_7:
    iVar2 = bcmp(__s1,"roundToInt",(size_t)this);
    if (iVar2 == 0) {
      return roundToInt;
    }
    if (6 < (long)this) {
      if (this == (soul *)0x7) goto switchD_001ae794_caseD_4;
LAB_001aee76:
      if (this != (soul *)0xe) goto switchD_001ae9c0_default;
      goto switchD_001ae794_caseD_b;
    }
    if (this == (soul *)0x3) {
switchD_001aec44_caseD_0:
      iVar2 = bcmp(__s1,"sum",(size_t)this);
      if (iVar2 == 0) {
        return sum;
      }
      if (0xd < (long)this) goto LAB_001aee76;
      if (this != (soul *)0x4) {
        if (this != (soul *)0x7) {
          return none;
        }
        goto switchD_001ae794_caseD_4;
      }
      goto switchD_001aedea_caseD_1;
    }
LAB_001aef06:
    if (this != (soul *)0x4) {
      return none;
    }
switchD_001aedea_caseD_1:
    iVar2 = bcmp(__s1,"read",(size_t)this);
    if (iVar2 == 0) {
      return read;
    }
    goto switchD_001ae9c0_default;
  case (soul *)0x9:
switchD_001ae794_caseD_9:
    iVar2 = bcmp(__s1,"addModulo2Pi",(size_t)this);
    if (iVar2 == 0) {
      return addModulo2Pi;
    }
    switch(psVar1) {
    case (soul *)0x0:
switchD_001ae9c0_caseD_0:
      iVar2 = bcmp(__s1,"pow",(size_t)this);
      if (iVar2 == 0) {
        return pow;
      }
      switch(psVar1) {
      case (soul *)0x0:
        iVar2 = bcmp(__s1,"exp",(size_t)this);
        if (iVar2 == 0) {
          return exp;
        }
        switch(psVar1) {
        case (soul *)0x0:
          iVar2 = bcmp(__s1,"log",(size_t)this);
          if (iVar2 == 0) {
            return log;
          }
          switch(psVar1) {
          case (soul *)0x0:
            goto switchD_001aead8_caseD_0;
          case (soul *)0x1:
            goto switchD_001aead8_caseD_1;
          case (soul *)0x2:
            goto switchD_001ae9c0_caseD_2;
          case (soul *)0x3:
          case (soul *)0x5:
          case (soul *)0x6:
          case (soul *)0x8:
          case (soul *)0x9:
          case (soul *)0xa:
            return none;
          case (soul *)0x4:
            goto switchD_001ae794_caseD_4;
          case (soul *)0x7:
            goto switchD_001ae794_caseD_7;
          case (soul *)0xb:
            goto switchD_001ae794_caseD_b;
          default:
            break;
          }
        case (soul *)0x1:
          goto switchD_001aead8_caseD_1;
        case (soul *)0x2:
          goto switchD_001ae9c0_caseD_2;
        case (soul *)0x3:
        case (soul *)0x5:
        case (soul *)0x6:
        case (soul *)0x8:
        case (soul *)0x9:
        case (soul *)0xa:
          return none;
        case (soul *)0x4:
          goto switchD_001ae794_caseD_4;
        case (soul *)0x7:
          goto switchD_001ae794_caseD_7;
        case (soul *)0xb:
          goto switchD_001ae794_caseD_b;
        }
        break;
      case (soul *)0x1:
        goto switchD_001aead8_caseD_1;
      case (soul *)0x2:
        goto switchD_001ae9c0_caseD_2;
      case (soul *)0x3:
      case (soul *)0x5:
      case (soul *)0x6:
      case (soul *)0x8:
      case (soul *)0x9:
      case (soul *)0xa:
        return none;
      case (soul *)0x4:
        goto switchD_001ae794_caseD_4;
      case (soul *)0x7:
        goto switchD_001ae794_caseD_7;
      case (soul *)0xb:
        goto switchD_001ae794_caseD_b;
      }
      break;
    case (soul *)0x1:
switchD_001ae9c0_caseD_1:
      iVar2 = bcmp(__s1,"sqrt",(size_t)this);
      if (iVar2 == 0) {
        return sqrt;
      }
      switch(psVar1) {
      case (soul *)0x0:
        goto switchD_001ae9c0_caseD_0;
      case (soul *)0x1:
        goto switchD_001aead8_caseD_1;
      case (soul *)0x2:
        goto switchD_001ae9c0_caseD_2;
      case (soul *)0x3:
      case (soul *)0x5:
      case (soul *)0x6:
      case (soul *)0x8:
      case (soul *)0x9:
      case (soul *)0xa:
        return none;
      case (soul *)0x4:
        goto switchD_001ae794_caseD_4;
      case (soul *)0x7:
        goto switchD_001ae794_caseD_7;
      case (soul *)0xb:
        goto switchD_001ae794_caseD_b;
      }
      break;
    case (soul *)0x2:
switchD_001ae9c0_caseD_2:
      iVar2 = bcmp(__s1,"log10",(size_t)this);
      if (iVar2 == 0) {
        return log10;
      }
      switch(psVar1) {
      case (soul *)0x0:
switchD_001aead8_caseD_0:
        iVar2 = bcmp(__s1,"sin",(size_t)this);
        if (iVar2 == 0) {
          return sin;
        }
        switch(psVar1) {
        case (soul *)0x0:
          iVar2 = bcmp(__s1,"cos",(size_t)this);
          if (iVar2 == 0) {
            return cos;
          }
          switch(psVar1) {
          case (soul *)0x0:
            iVar2 = bcmp(__s1,"tan",(size_t)this);
            if (iVar2 == 0) {
              return tan;
            }
            switch(psVar1) {
            case (soul *)0x0:
              goto switchD_001aec44_caseD_0;
            case (soul *)0x1:
              goto switchD_001aead8_caseD_1;
            case (soul *)0x2:
              goto switchD_001aead8_caseD_2;
            case (soul *)0x3:
            case (soul *)0x5:
            case (soul *)0x6:
            case (soul *)0x8:
            case (soul *)0x9:
            case (soul *)0xa:
              return none;
            case (soul *)0x4:
              goto switchD_001ae794_caseD_4;
            case (soul *)0x7:
              goto switchD_001ae794_caseD_7;
            case (soul *)0xb:
              goto switchD_001ae794_caseD_b;
            default:
              break;
            }
          case (soul *)0x1:
            goto switchD_001aead8_caseD_1;
          case (soul *)0x2:
            goto switchD_001aead8_caseD_2;
          case (soul *)0x3:
          case (soul *)0x5:
          case (soul *)0x6:
          case (soul *)0x8:
          case (soul *)0x9:
          case (soul *)0xa:
            return none;
          case (soul *)0x4:
            goto switchD_001ae794_caseD_4;
          case (soul *)0x7:
            goto switchD_001ae794_caseD_7;
          case (soul *)0xb:
            goto switchD_001ae794_caseD_b;
          }
          break;
        case (soul *)0x1:
          goto switchD_001aead8_caseD_1;
        case (soul *)0x2:
          goto switchD_001aead8_caseD_2;
        case (soul *)0x3:
        case (soul *)0x5:
        case (soul *)0x6:
        case (soul *)0x8:
        case (soul *)0x9:
        case (soul *)0xa:
          return none;
        case (soul *)0x4:
          goto switchD_001ae794_caseD_4;
        case (soul *)0x7:
          goto switchD_001ae794_caseD_7;
        case (soul *)0xb:
          goto switchD_001ae794_caseD_b;
        }
        break;
      case (soul *)0x1:
switchD_001aead8_caseD_1:
        iVar2 = bcmp(__s1,"sinh",(size_t)this);
        if (iVar2 == 0) {
          return sinh;
        }
        switch(psVar1) {
        case (soul *)0x0:
          goto switchD_001aec44_caseD_0;
        case (soul *)0x1:
          iVar2 = bcmp(__s1,"cosh",(size_t)this);
          if (iVar2 == 0) {
            return cosh;
          }
          switch(psVar1) {
          case (soul *)0x0:
            goto switchD_001aec44_caseD_0;
          case (soul *)0x1:
            iVar2 = bcmp(__s1,"tanh",(size_t)this);
            if (iVar2 == 0) {
              return tanh;
            }
            switch(psVar1) {
            case (soul *)0x0:
              goto switchD_001aec44_caseD_0;
            case (soul *)0x1:
              goto switchD_001aec44_caseD_1;
            case (soul *)0x2:
              goto switchD_001aead8_caseD_2;
            case (soul *)0x3:
            case (soul *)0x5:
            case (soul *)0x6:
            case (soul *)0x8:
            case (soul *)0x9:
            case (soul *)0xa:
              return none;
            case (soul *)0x4:
              goto switchD_001ae794_caseD_4;
            case (soul *)0x7:
              goto switchD_001ae794_caseD_7;
            case (soul *)0xb:
              goto switchD_001ae794_caseD_b;
            default:
              break;
            }
          case (soul *)0x2:
            goto switchD_001aead8_caseD_2;
          case (soul *)0x3:
          case (soul *)0x5:
          case (soul *)0x6:
          case (soul *)0x8:
          case (soul *)0x9:
          case (soul *)0xa:
            return none;
          case (soul *)0x4:
            goto switchD_001ae794_caseD_4;
          case (soul *)0x7:
            goto switchD_001ae794_caseD_7;
          case (soul *)0xb:
            goto switchD_001ae794_caseD_b;
          }
          break;
        case (soul *)0x2:
          goto switchD_001aead8_caseD_2;
        case (soul *)0x3:
        case (soul *)0x5:
        case (soul *)0x6:
        case (soul *)0x8:
        case (soul *)0x9:
        case (soul *)0xa:
          return none;
        case (soul *)0x4:
          goto switchD_001ae794_caseD_4;
        case (soul *)0x7:
          goto switchD_001ae794_caseD_7;
        case (soul *)0xb:
          goto switchD_001ae794_caseD_b;
        }
        break;
      case (soul *)0x2:
switchD_001aead8_caseD_2:
        iVar2 = bcmp(__s1,"asinh",(size_t)this);
        if (iVar2 == 0) {
          return asinh;
        }
        switch(psVar1) {
        case (soul *)0x0:
          goto switchD_001aec44_caseD_0;
        case (soul *)0x1:
switchD_001aec44_caseD_1:
          iVar2 = bcmp(__s1,"asin",(size_t)this);
          if (iVar2 == 0) {
            return asin;
          }
          switch(psVar1) {
          case (soul *)0x0:
            goto switchD_001aec44_caseD_0;
          case (soul *)0x1:
            iVar2 = bcmp(__s1,"acos",(size_t)this);
            if (iVar2 == 0) {
              return acos;
            }
            switch(psVar1) {
            case (soul *)0x0:
              goto switchD_001aec44_caseD_0;
            case (soul *)0x1:
              iVar2 = bcmp(__s1,"atan",(size_t)this);
              if (iVar2 == 0) {
                return atan;
              }
              switch(psVar1) {
              case (soul *)0x0:
                goto switchD_001aec44_caseD_0;
              case (soul *)0x1:
                goto switchD_001aedea_caseD_1;
              case (soul *)0x2:
                goto switchD_001aec78_caseD_2;
              case (soul *)0x3:
              case (soul *)0x5:
              case (soul *)0x6:
              case (soul *)0x8:
              case (soul *)0x9:
              case (soul *)0xa:
                return none;
              case (soul *)0x4:
                goto switchD_001ae794_caseD_4;
              case (soul *)0x7:
                goto switchD_001ae794_caseD_7;
              case (soul *)0xb:
                goto switchD_001ae794_caseD_b;
              default:
                break;
              }
            case (soul *)0x2:
              goto switchD_001aec78_caseD_2;
            case (soul *)0x3:
            case (soul *)0x5:
            case (soul *)0x6:
            case (soul *)0x8:
            case (soul *)0x9:
            case (soul *)0xa:
              return none;
            case (soul *)0x4:
              goto switchD_001ae794_caseD_4;
            case (soul *)0x7:
              goto switchD_001ae794_caseD_7;
            case (soul *)0xb:
              goto switchD_001ae794_caseD_b;
            }
            break;
          case (soul *)0x2:
switchD_001aec78_caseD_2:
            iVar2 = bcmp(__s1,"atan2",(size_t)this);
            if (iVar2 == 0) {
              return atan2;
            }
            switch(psVar1) {
            case (soul *)0x0:
              goto switchD_001aec44_caseD_0;
            case (soul *)0x1:
              goto switchD_001aedea_caseD_1;
            case (soul *)0x2:
              iVar2 = bcmp(__s1,"isnan",(size_t)this);
              if (iVar2 == 0) {
                return isnan;
              }
              switch(psVar1) {
              case (soul *)0x0:
                goto switchD_001aec44_caseD_0;
              case (soul *)0x1:
                goto switchD_001aedea_caseD_1;
              case (soul *)0x2:
                iVar2 = bcmp(__s1,"isinf",(size_t)this);
                if (iVar2 == 0) {
                  return isinf;
                }
                switch(psVar1) {
                case (soul *)0x0:
                  goto switchD_001aec44_caseD_0;
                case (soul *)0x1:
                  goto switchD_001aedea_caseD_1;
                case (soul *)0x2:
                case (soul *)0x3:
                case (soul *)0x5:
                case (soul *)0x6:
                case (soul *)0x8:
                case (soul *)0x9:
                case (soul *)0xa:
                  return none;
                case (soul *)0x4:
                  goto switchD_001ae794_caseD_4;
                case (soul *)0x7:
                  goto switchD_001ae794_caseD_7;
                case (soul *)0xb:
                  goto switchD_001ae794_caseD_b;
                }
                break;
              case (soul *)0x3:
              case (soul *)0x5:
              case (soul *)0x6:
              case (soul *)0x8:
              case (soul *)0x9:
              case (soul *)0xa:
                return none;
              case (soul *)0x4:
                goto switchD_001ae794_caseD_4;
              case (soul *)0x7:
                goto switchD_001ae794_caseD_7;
              case (soul *)0xb:
                goto switchD_001ae794_caseD_b;
              }
              break;
            case (soul *)0x3:
            case (soul *)0x5:
            case (soul *)0x6:
            case (soul *)0x8:
            case (soul *)0x9:
            case (soul *)0xa:
              return none;
            case (soul *)0x4:
              goto switchD_001ae794_caseD_4;
            case (soul *)0x7:
              goto switchD_001ae794_caseD_7;
            case (soul *)0xb:
              goto switchD_001ae794_caseD_b;
            }
            break;
          case (soul *)0x3:
          case (soul *)0x5:
          case (soul *)0x6:
          case (soul *)0x8:
          case (soul *)0x9:
          case (soul *)0xa:
            return none;
          case (soul *)0x4:
            goto switchD_001ae794_caseD_4;
          case (soul *)0x7:
            goto switchD_001ae794_caseD_7;
          case (soul *)0xb:
            goto switchD_001ae794_caseD_b;
          }
          break;
        case (soul *)0x2:
          iVar2 = bcmp(__s1,"acosh",(size_t)this);
          if (iVar2 == 0) {
            return acosh;
          }
          switch(psVar1) {
          case (soul *)0x0:
            goto switchD_001aec44_caseD_0;
          case (soul *)0x1:
            goto switchD_001aec44_caseD_1;
          case (soul *)0x2:
            iVar2 = bcmp(__s1,"atanh",(size_t)this);
            if (iVar2 == 0) {
              return atanh;
            }
            switch(psVar1) {
            case (soul *)0x0:
              goto switchD_001aec44_caseD_0;
            case (soul *)0x1:
              goto switchD_001aec44_caseD_1;
            case (soul *)0x2:
              goto switchD_001aec78_caseD_2;
            case (soul *)0x3:
            case (soul *)0x5:
            case (soul *)0x6:
            case (soul *)0x8:
            case (soul *)0x9:
            case (soul *)0xa:
              return none;
            case (soul *)0x4:
              goto switchD_001ae794_caseD_4;
            case (soul *)0x7:
              goto switchD_001ae794_caseD_7;
            case (soul *)0xb:
              goto switchD_001ae794_caseD_b;
            default:
              break;
            }
          case (soul *)0x3:
          case (soul *)0x5:
          case (soul *)0x6:
          case (soul *)0x8:
          case (soul *)0x9:
          case (soul *)0xa:
            return none;
          case (soul *)0x4:
            goto switchD_001ae794_caseD_4;
          case (soul *)0x7:
            goto switchD_001ae794_caseD_7;
          case (soul *)0xb:
            goto switchD_001ae794_caseD_b;
          }
          break;
        case (soul *)0x3:
        case (soul *)0x5:
        case (soul *)0x6:
        case (soul *)0x8:
        case (soul *)0x9:
        case (soul *)0xa:
          return none;
        case (soul *)0x4:
          goto switchD_001ae794_caseD_4;
        case (soul *)0x7:
          goto switchD_001ae794_caseD_7;
        case (soul *)0xb:
          goto switchD_001ae794_caseD_b;
        }
        break;
      case (soul *)0x3:
      case (soul *)0x5:
      case (soul *)0x6:
      case (soul *)0x8:
      case (soul *)0x9:
      case (soul *)0xa:
        return none;
      case (soul *)0x4:
        goto switchD_001ae794_caseD_4;
      case (soul *)0x7:
        goto switchD_001ae794_caseD_7;
      case (soul *)0xb:
        goto switchD_001ae794_caseD_b;
      }
      break;
    case (soul *)0x3:
    case (soul *)0x5:
    case (soul *)0x6:
    case (soul *)0x8:
    case (soul *)0x9:
    case (soul *)0xa:
      return none;
    case (soul *)0x4:
      goto switchD_001ae794_caseD_4;
    case (soul *)0x7:
      goto switchD_001ae794_caseD_7;
    case (soul *)0xb:
      goto switchD_001ae794_caseD_b;
    }
switchD_001ae9c0_default:
    if (this != (soul *)0x16) {
      return none;
    }
    break;
  case (soul *)0xb:
switchD_001ae794_caseD_b:
    iVar2 = bcmp(__s1,"get_array_size",(size_t)this);
    if (iVar2 == 0) {
      return get_array_size;
    }
    if (this != (soul *)0x16) goto LAB_001aef06;
    break;
  case (soul *)0x13:
    break;
  }
  iVar2 = bcmp(__s1,"readLinearInterpolated",(size_t)this);
  IVar3 = readLinearInterpolated;
  if (iVar2 != 0) {
    IVar3 = none;
  }
switchD_001ae794_caseD_3:
  return IVar3;
}

Assistant:

IntrinsicType getIntrinsicTypeFromName (std::string_view s)
{
    #define SOUL_MATCH_INTRINSIC(i)  if (s == #i) return IntrinsicType::i;
    SOUL_INTRINSICS (SOUL_MATCH_INTRINSIC)
    #undef SOUL_MATCH_INTRINSIC

    return IntrinsicType::none;
}